

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O2

void google::AddXMLTag(string *r,char *tag,string *txt)

{
  string local_38;
  
  XMLText(&local_38,txt);
  StringAppendF(r,"<%s>%s</%s>",tag,local_38._M_dataplus._M_p,tag);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

static void AddXMLTag(string* r, const char* tag, const string& txt) {
  StringAppendF(r, "<%s>%s</%s>", tag, XMLText(txt).c_str(), tag);
}